

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chain.hpp
# Opt level: O0

string_view __thiscall
chain::str::trim_left_view<(chain::str::case_t)0>
          (str *this,string_view data,
          vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
          *to_remove)

{
  string_view data_00;
  string_view sVar1;
  string_view begin;
  bool bVar2;
  bool bVar3;
  reference this_00;
  size_type __n;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *this_01;
  basic_string_view<char,_std::char_traits<char>_> *remove;
  const_iterator __end4;
  const_iterator __begin4;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *__range4;
  bool had_removal;
  vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  *to_remove_local;
  string_view data_local;
  
  this_01 = (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
             *)data._M_str;
  data_local._M_len = data._M_len;
  to_remove_local =
       (vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
        *)this;
  bVar2 = std::basic_string_view<char,_std::char_traits<char>_>::empty
                    ((basic_string_view<char,_std::char_traits<char>_> *)&to_remove_local);
  if ((!bVar2) &&
     (bVar2 = std::
              vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
              ::empty(this_01), !bVar2)) {
    do {
      bVar2 = false;
      __end4 = std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::begin(this_01);
      remove = (basic_string_view<char,_std::char_traits<char>_> *)
               std::
               vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
               ::end(this_01);
      while (bVar3 = __gnu_cxx::operator!=
                               (&__end4,(__normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                                         *)&remove), bVar3) {
        this_00 = __gnu_cxx::
                  __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
                  ::operator*(&__end4);
        while (begin._M_len = this_00->_M_len, begin._M_str = this_00->_M_str,
              data_00._M_str = (char *)data_local._M_len, data_00._M_len = (size_t)to_remove_local,
              bVar3 = starts_with<(chain::str::case_t)0>(data_00,begin), bVar3) {
          __n = std::basic_string_view<char,_std::char_traits<char>_>::size(this_00);
          std::basic_string_view<char,_std::char_traits<char>_>::remove_prefix
                    ((basic_string_view<char,_std::char_traits<char>_> *)&to_remove_local,__n);
          bVar2 = true;
        }
        __gnu_cxx::
        __normal_iterator<const_std::basic_string_view<char,_std::char_traits<char>_>_*,_std::vector<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>_>
        ::operator++(&__end4);
      }
    } while (bVar2);
  }
  sVar1._M_str = (char *)data_local._M_len;
  sVar1._M_len = (size_t)to_remove_local;
  return sVar1;
}

Assistant:

auto trim_left_view(std::string_view data, const std::vector<std::string_view>& to_remove) -> std::string_view
{
    if (!data.empty() && !to_remove.empty())
    {
        while (true)
        {
            bool had_removal{false};

            for (const auto& remove : to_remove)
            {
                while (starts_with<case_type>(data, remove))
                {
                    data.remove_prefix(remove.size());
                    had_removal = true;
                }
            }

            if (!had_removal)
            {
                break;
            }
        }
    }

    return data;
}